

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase90::run(TestCase90 *this)

{
  char *pcVar1;
  undefined1 local_50 [8];
  Array<char> chars_1;
  undefined1 local_28 [8];
  Array<char> chars;
  TestCase90 *this_local;
  
  chars.disposer = (ArrayDisposer *)this;
  heapArray<char>((Array<char> *)local_28,0x20);
  pcVar1 = Array<char>::operator[]((Array<char> *)local_28,0);
  *pcVar1 = '\f';
  pcVar1 = Array<char>::operator[]((Array<char> *)local_28,1);
  *pcVar1 = '\"';
  Array<char>::~Array((Array<char> *)local_28);
  heapArray<char>((Array<char> *)local_50,0x20);
  Array<char>::~Array((Array<char> *)local_50);
  return;
}

Assistant:

TEST(Array, TrivialConstructor) {
//  char* ptr;
  {
    Array<char> chars = heapArray<char>(32);
//    ptr = chars.begin();
    chars[0] = 12;
    chars[1] = 34;
  }

  {
    Array<char> chars = heapArray<char>(32);

    // TODO(test):  The following doesn't work in opt mode -- I guess some allocators zero the
    //   memory?  Is there some other way we can test this?  Maybe override malloc()?
//    // Somewhat hacky:  We can't guarantee that the new array is allocated in the same place, but
//    // any reasonable allocator is highly likely to do so.  If it does, then we expect that the
//    // memory has not been initialized.
//    if (chars.begin() == ptr) {
//      EXPECT_NE(chars[0], 0);
//      EXPECT_NE(chars[1], 0);
//    }
  }
}